

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::MaximumValue(Value *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  bool bVar2;
  byte width;
  uint8_t scale;
  date_t value;
  idx_t iVar3;
  timestamp_t tVar4;
  InvalidTypeException *this;
  InternalException *this_00;
  string_t *in_RDX;
  int64_t value_00;
  undefined1 auVar5 [16];
  hugeint_t value_01;
  hugeint_t value_02;
  uhugeint_t value_03;
  hugeint_t value_04;
  timestamp_ms_t result;
  LogicalType local_88;
  Value local_70;
  
  switch(type->id_) {
  case SQLNULL:
  case INTEGER:
    INTEGER(__return_storage_ptr__,0x7fffffff);
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_00db2be9_caseD_2:
    this = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    local_70.type_._0_8_ =
         &local_70.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"MaximumValue requires numeric type","");
    InvalidTypeException::InvalidTypeException(this,type,(string *)&local_70);
    __cxa_throw(this,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    BOOLEAN(__return_storage_ptr__,true);
    break;
  case TINYINT:
    TINYINT(__return_storage_ptr__,'\x7f');
    break;
  case SMALLINT:
    SMALLINT(__return_storage_ptr__,0x7fff);
    break;
  case BIGINT:
    BIGINT(__return_storage_ptr__,0x7fffffffffffffff);
    break;
  case DATE:
    value = Date::FromDate(0x59beec,7,10);
    DATE(__return_storage_ptr__,value);
    break;
  case TIME:
    TIME(__return_storage_ptr__,(dtime_t)0x141dd76000);
    break;
  case TIMESTAMP_SEC:
    LogicalType::LogicalType(&local_88,TIMESTAMP);
    MaximumValue(&local_70,&local_88);
    tVar4 = GetValueInternal<duckdb::timestamp_t>(&local_70);
    ~Value(&local_70);
    LogicalType::~LogicalType(&local_88);
    bVar2 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_sec_t>
                      (tVar4,(timestamp_sec_t *)&local_88,false);
    if (!bVar2) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_sec_t>
                ((string *)&local_70,(duckdb *)tVar4.value,(timestamp_t)auVar5._8_8_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_70);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    TIMESTAMPSEC(__return_storage_ptr__,(timestamp_sec_t)local_88._0_8_);
    break;
  case TIMESTAMP_MS:
    LogicalType::LogicalType(&local_88,TIMESTAMP);
    MaximumValue(&local_70,&local_88);
    tVar4 = GetValueInternal<duckdb::timestamp_t>(&local_70);
    ~Value(&local_70);
    LogicalType::~LogicalType(&local_88);
    bVar2 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_ms_t>
                      (tVar4,(timestamp_ms_t *)&local_88,false);
    if (!bVar2) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_ms_t>
                ((string *)&local_70,(duckdb *)tVar4.value,(timestamp_t)auVar5._8_8_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_70);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    TIMESTAMPMS(__return_storage_ptr__,(timestamp_ms_t)local_88._0_8_);
    break;
  case TIMESTAMP:
    TIMESTAMP(__return_storage_ptr__,(timestamp_t)0x7ffffffffffffffe);
    break;
  case TIMESTAMP_NS:
    TIMESTAMPNS(__return_storage_ptr__,(timestamp_ns_t)0x7ffffffffffffffe);
    break;
  case DECIMAL:
    width = DecimalType::GetWidth(type);
    scale = DecimalType::GetScale(type);
    PVar1 = type->physical_type_;
    if (PVar1 < INT64) {
      if (PVar1 == INT16) {
        value_00 = (int64_t)(short)((short)*(undefined4 *)
                                            (NumericHelper::POWERS_OF_TEN + (ulong)width * 8) + -1);
      }
      else {
        if (PVar1 != INT32) goto LAB_00db30bf;
        value_00 = (int64_t)(*(int *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8) + -1);
      }
    }
    else {
      if (PVar1 != INT64) {
        if (PVar1 == INT128) {
          hugeint_t::hugeint_t((hugeint_t *)&local_70,1);
          value_04.lower =
               (long)*(__shared_count<(__gnu_cxx::_Lock_policy)2> ***)
                      (Hugeint::POWERS_OF_TEN + (ulong)width * 0x10) - local_70.type_._0_8_;
          value_04.upper =
               (*(long *)(Hugeint::POWERS_OF_TEN + (ulong)width * 0x10 + 8) -
               (long)local_70.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) -
               (ulong)(*(__shared_count<(__gnu_cxx::_Lock_policy)2> ***)
                        (Hugeint::POWERS_OF_TEN + (ulong)width * 0x10) < (ulong)local_70.type_._0_8_
                      );
          DECIMAL(__return_storage_ptr__,value_04,width,scale);
          return __return_storage_ptr__;
        }
LAB_00db30bf:
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_70.type_._0_8_ =
             &local_70.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Unknown decimal type","");
        InternalException::InternalException(this_00,(string *)&local_70);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value_00 = *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8) + -1;
    }
    DECIMAL(__return_storage_ptr__,value_00,width,scale);
    break;
  case FLOAT:
    FLOAT(__return_storage_ptr__,3.4028235e+38);
    break;
  case DOUBLE:
    DOUBLE(__return_storage_ptr__,1.79769313486232e+308);
    break;
  case UTINYINT:
    UTINYINT(__return_storage_ptr__,0xff);
    break;
  case USMALLINT:
    USMALLINT(__return_storage_ptr__,0xffff);
    break;
  case UINTEGER:
    UINTEGER(__return_storage_ptr__,0xffffffff);
    break;
  case UBIGINT:
    UBIGINT(__return_storage_ptr__,0xffffffffffffffff);
    break;
  case TIMESTAMP_TZ:
    TIMESTAMPTZ(__return_storage_ptr__,(timestamp_tz_t)0x7ffffffffffffffe);
    break;
  case TIME_TZ:
    TIMETZ(__return_storage_ptr__,(dtime_tz_t)0x141dd7600001c1fe);
    break;
  case VARINT:
    local_88.id_ = VALIDITY;
    local_88.physical_type_ = BOOL;
    local_88._2_6_ = 0x373937310000;
    local_88.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x1db5c1d;
    Varint::VarcharToVarInt_abi_cxx11_((string *)&local_70,(Varint *)&local_88,in_RDX);
    VARINT(__return_storage_ptr__,(string *)&local_70);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_70.type_._0_8_ !=
        &local_70.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_70.type_._0_8_);
    }
    break;
  case UHUGEINT:
    value_03.upper = (uint64_t)&switchD_00db2be9::switchdataD_01db04ac;
    value_03.lower = 0xffffffffffffffff;
    UHUGEINT(__return_storage_ptr__,(Value *)0xffffffffffffffff,value_03);
    break;
  case HUGEINT:
    value_01.upper = (int64_t)&switchD_00db2be9::switchdataD_01db04ac;
    value_01.lower = 0x7fffffffffffffff;
    HUGEINT(__return_storage_ptr__,(Value *)0xffffffffffffffff,value_01);
    break;
  case UUID:
    value_02.upper = (int64_t)&switchD_00db2be9::switchdataD_01db04ac;
    value_02.lower = 0x7fffffffffffffff;
    UUID(__return_storage_ptr__,(Value *)0xffffffffffffffff,value_02);
    break;
  default:
    if (type->id_ != ENUM) goto switchD_00db2be9_caseD_2;
    iVar3 = EnumType::GetSize(type);
    ENUM(__return_storage_ptr__,(iVar3 - 1) + (ulong)(iVar3 == 0),type);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::MaximumValue(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return Value::BOOLEAN(true);
	case LogicalTypeId::TINYINT:
		return Value::TINYINT(NumericLimits<int8_t>::Maximum());
	case LogicalTypeId::SMALLINT:
		return Value::SMALLINT(NumericLimits<int16_t>::Maximum());
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::SQLNULL:
		return Value::INTEGER(NumericLimits<int32_t>::Maximum());
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(NumericLimits<int64_t>::Maximum());
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(NumericLimits<hugeint_t>::Maximum());
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(NumericLimits<uhugeint_t>::Maximum());
	case LogicalTypeId::UUID:
		return Value::UUID(NumericLimits<hugeint_t>::Maximum());
	case LogicalTypeId::UTINYINT:
		return Value::UTINYINT(NumericLimits<uint8_t>::Maximum());
	case LogicalTypeId::USMALLINT:
		return Value::USMALLINT(NumericLimits<uint16_t>::Maximum());
	case LogicalTypeId::UINTEGER:
		return Value::UINTEGER(NumericLimits<uint32_t>::Maximum());
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(NumericLimits<uint64_t>::Maximum());
	case LogicalTypeId::DATE:
		return Value::DATE(Date::FromDate(Date::DATE_MAX_YEAR, Date::DATE_MAX_MONTH, Date::DATE_MAX_DAY));
	case LogicalTypeId::TIME:
		//	24:00:00 according to PG
		return Value::TIME(dtime_t(Interval::MICROS_PER_DAY));
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(timestamp_t(NumericLimits<int64_t>::Maximum() - 1));
	case LogicalTypeId::TIMESTAMP_SEC: {
		// Get the maximum timestamp and cast it to timestamp_s_t.
		const auto max_ts = MaximumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_sec_t>(max_ts);
		return Value::TIMESTAMPSEC(ts);
	}
	case LogicalTypeId::TIMESTAMP_MS: {
		// Get the maximum timestamp and cast it to timestamp_ms_t.
		const auto max_ts = MaximumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_ms_t>(max_ts);
		return Value::TIMESTAMPMS(ts);
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		const auto ts = timestamp_ns_t(NumericLimits<int64_t>::Maximum() - 1);
		return Value::TIMESTAMPNS(ts);
	}
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(timestamp_tz_t(NumericLimits<int64_t>::Maximum() - 1));
	case LogicalTypeId::TIME_TZ:
		// "24:00:00-1559" from the PG docs but actually "24:00:00-15:59:59".
		return Value::TIMETZ(dtime_tz_t(dtime_t(Interval::MICROS_PER_DAY), dtime_tz_t::MIN_OFFSET));
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(NumericLimits<float>::Maximum());
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(NumericLimits<double>::Maximum());
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(int16_t(NumericHelper::POWERS_OF_TEN[width] - 1), width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(int32_t(NumericHelper::POWERS_OF_TEN[width] - 1), width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(int64_t(NumericHelper::POWERS_OF_TEN[width] - 1), width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(Hugeint::POWERS_OF_TEN[width] - 1, width, scale);
		default:
			throw InternalException("Unknown decimal type");
		}
	}
	case LogicalTypeId::ENUM: {
		auto enum_size = EnumType::GetSize(type);
		return Value::ENUM(enum_size - (enum_size ? 1 : 0), type);
	}
	case LogicalTypeId::VARINT:
		return Value::VARINT(Varint::VarcharToVarInt(
		    "1797693134862315708145274237317043567980705675258449965989174768031572607800285387605895586327668781715404"
		    "5895351438246423432132688946418276846754670353751698604991057655128207624549009038932894407586850845513394"
		    "2304583236903222948165808559332123348274797826204144723168738177180919299881250404026184124858368"));
	default:
		throw InvalidTypeException(type, "MaximumValue requires numeric type");
	}
}